

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringInternalCache.cpp
# Opt level: O1

void __thiscall GlobalSimpleStringCache::~GlobalSimpleStringCache(GlobalSimpleStringCache *this)

{
  SimpleString::setStringAllocator(this->allocator_->originalAllocator_);
  SimpleStringInternalCache::clearAllIncludingCurrentlyUsedMemory(&this->cache_);
  if (this->allocator_ != (SimpleStringCacheAllocator *)0x0) {
    (*(this->allocator_->super_TestMemoryAllocator)._vptr_TestMemoryAllocator[1])();
  }
  SimpleStringInternalCache::~SimpleStringInternalCache(&this->cache_);
  return;
}

Assistant:

GlobalSimpleStringCache::~GlobalSimpleStringCache()
{
    SimpleString::setStringAllocator(allocator_->originalAllocator());
    cache_.clearAllIncludingCurrentlyUsedMemory();
    delete allocator_;
}